

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateFunctionDefinition(ExpressionEvalContext *ctx,ExprFunctionDefinition *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  FunctionData *pFVar5;
  TypeFunction *pTVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined8 *puVar8;
  TypeRef *pTVar9;
  undefined4 extraout_var_01;
  ExprBase *pEVar10;
  undefined4 extraout_var_00;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pAVar2 = ctx->ctx->allocator;
      iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      puVar8 = (undefined8 *)CONCAT44(extraout_var_00,iVar7);
      pSVar3 = (expression->super_ExprBase).source;
      pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
      *(undefined4 *)(puVar8 + 1) = 9;
      puVar8[2] = pSVar3;
      puVar8[3] = pTVar9;
      puVar8[4] = 0;
      *(undefined1 *)(puVar8 + 5) = 0;
      *puVar8 = &PTR__ExprBase_002405e0;
      pAVar2 = ctx->ctx->allocator;
      iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
      pSVar3 = (expression->super_ExprBase).source;
      pFVar5 = expression->function;
      pTVar6 = pFVar5->type;
      pEVar10->typeID = 0xb;
      pEVar10->source = pSVar3;
      pEVar10->type = &pTVar6->super_TypeBase;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240618;
      pEVar10[1]._vptr_ExprBase = (_func_int **)pFVar5;
      *(undefined8 **)&pEVar10[1].typeID = puVar8;
      pEVar10 = CheckType(&expression->super_ExprBase,pEVar10);
      return pEVar10;
    }
    pEVar10 = (ExprBase *)0x0;
    Report(ctx,"ERROR: instruction limit reached");
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var,iVar7);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar10->typeID = 2;
    pEVar10->source = pSVar3;
    pEVar10->type = pTVar4;
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240688;
  }
  return pEVar10;
}

Assistant:

ExprBase* EvaluateFunctionDefinition(ExpressionEvalContext &ctx, ExprFunctionDefinition *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *context = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

	return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->function->type, expression->function, context));
}